

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSOpen(UConverter *cnv,UConverterLoadArgs *pArgs,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  UConverterSharedData *pUVar2;
  int32_t (*paiVar3) [256];
  int32_t *piVar4;
  UBool UVar5;
  char *pcVar6;
  uint uVar7;
  char local_32;
  UBool isCached;
  int8_t maxBytesPerUChar;
  uint8_t outputType;
  int32_t *extIndexes;
  UConverterMBCSTable *mbcsTable;
  UErrorCode *pErrorCode_local;
  UConverterLoadArgs *pArgs_local;
  UConverter *cnv_local;
  
  if (pArgs->onlyTestIsLoadable == '\0') {
    pUVar2 = cnv->sharedData;
    uVar1 = (pUVar2->mbcs).outputType;
    if (uVar1 == 0xdb) {
      uVar7 = pArgs->options & 0xffffffef;
      pArgs->options = uVar7;
      cnv->options = uVar7;
    }
    if ((pArgs->options & 0x10) != 0) {
      umtx_lock_63((UMutex *)0x0);
      paiVar3 = (pUVar2->mbcs).swapLFNLStateTable;
      umtx_unlock_63((UMutex *)0x0);
      if ((paiVar3 == (int32_t (*) [256])0x0) &&
         (UVar5 = _EBCDICSwapLFNL(cnv->sharedData,pErrorCode), UVar5 == '\0')) {
        UVar5 = U_FAILURE(*pErrorCode);
        if (UVar5 != '\0') {
          return;
        }
        uVar7 = pArgs->options & 0xffffffef;
        pArgs->options = uVar7;
        cnv->options = uVar7;
      }
    }
    pcVar6 = strstr(pArgs->name,"18030");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strstr(pArgs->name,"KEIS");
      if ((pcVar6 == (char *)0x0) && (pcVar6 = strstr(pArgs->name,"keis"), pcVar6 == (char *)0x0)) {
        pcVar6 = strstr(pArgs->name,"JEF");
        if ((pcVar6 == (char *)0x0) && (pcVar6 = strstr(pArgs->name,"jef"), pcVar6 == (char *)0x0))
        {
          pcVar6 = strstr(pArgs->name,"JIPS");
          if ((pcVar6 != (char *)0x0) ||
             (pcVar6 = strstr(pArgs->name,"jips"), pcVar6 != (char *)0x0)) {
            cnv->options = cnv->options | 0x4000;
          }
        }
        else {
          cnv->options = cnv->options | 0x2000;
        }
      }
      else {
        cnv->options = cnv->options | 0x1000;
      }
    }
    else {
      pcVar6 = strstr(pArgs->name,"gb18030");
      if ((pcVar6 != (char *)0x0) || (pcVar6 = strstr(pArgs->name,"GB18030"), pcVar6 != (char *)0x0)
         ) {
        cnv->options = cnv->options | 0x8000;
      }
    }
    if (uVar1 == '\f') {
      cnv->maxBytesPerUChar = '\x03';
    }
    piVar4 = (pUVar2->mbcs).extIndexes;
    if (piVar4 != (int32_t *)0x0) {
      local_32 = (char)piVar4[0x11];
      if (uVar1 == '\f') {
        local_32 = local_32 + '\x01';
      }
      if (cnv->maxBytesPerUChar < local_32) {
        cnv->maxBytesPerUChar = local_32;
      }
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSOpen(UConverter *cnv,
              UConverterLoadArgs *pArgs,
              UErrorCode *pErrorCode) {
    UConverterMBCSTable *mbcsTable;
    const int32_t *extIndexes;
    uint8_t outputType;
    int8_t maxBytesPerUChar;

    if(pArgs->onlyTestIsLoadable) {
        return;
    }

    mbcsTable=&cnv->sharedData->mbcs;
    outputType=mbcsTable->outputType;

    if(outputType==MBCS_OUTPUT_DBCS_ONLY) {
        /* the swaplfnl option does not apply, remove it */
        cnv->options=pArgs->options&=~UCNV_OPTION_SWAP_LFNL;
    }

    if((pArgs->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        /* do this because double-checked locking is broken */
        UBool isCached;

        umtx_lock(NULL);
        isCached=mbcsTable->swapLFNLStateTable!=NULL;
        umtx_unlock(NULL);

        if(!isCached) {
            if(!_EBCDICSwapLFNL(cnv->sharedData, pErrorCode)) {
                if(U_FAILURE(*pErrorCode)) {
                    return; /* something went wrong */
                }

                /* the option does not apply, remove it */
                cnv->options=pArgs->options&=~UCNV_OPTION_SWAP_LFNL;
            }
        }
    }

    if(uprv_strstr(pArgs->name, "18030")!=NULL) {
        if(uprv_strstr(pArgs->name, "gb18030")!=NULL || uprv_strstr(pArgs->name, "GB18030")!=NULL) {
            /* set a flag for GB 18030 mode, which changes the callback behavior */
            cnv->options|=_MBCS_OPTION_GB18030;
        }
    } else if((uprv_strstr(pArgs->name, "KEIS")!=NULL) || (uprv_strstr(pArgs->name, "keis")!=NULL)) {
        /* set a flag for KEIS converter, which changes the SI/SO character sequence */
        cnv->options|=_MBCS_OPTION_KEIS;
    } else if((uprv_strstr(pArgs->name, "JEF")!=NULL) || (uprv_strstr(pArgs->name, "jef")!=NULL)) {
        /* set a flag for JEF converter, which changes the SI/SO character sequence */
        cnv->options|=_MBCS_OPTION_JEF;
    } else if((uprv_strstr(pArgs->name, "JIPS")!=NULL) || (uprv_strstr(pArgs->name, "jips")!=NULL)) {
        /* set a flag for JIPS converter, which changes the SI/SO character sequence */
        cnv->options|=_MBCS_OPTION_JIPS;
    }

    /* fix maxBytesPerUChar depending on outputType and options etc. */
    if(outputType==MBCS_OUTPUT_2_SISO) {
        cnv->maxBytesPerUChar=3; /* SO+DBCS */
    }

    extIndexes=mbcsTable->extIndexes;
    if(extIndexes!=NULL) {
        maxBytesPerUChar=(int8_t)UCNV_GET_MAX_BYTES_PER_UCHAR(extIndexes);
        if(outputType==MBCS_OUTPUT_2_SISO) {
            ++maxBytesPerUChar; /* SO + multiple DBCS */
        }

        if(maxBytesPerUChar>cnv->maxBytesPerUChar) {
            cnv->maxBytesPerUChar=maxBytesPerUChar;
        }
    }

#if 0
    /*
     * documentation of UConverter fields used for status
     * all of these fields are (re)set to 0 by ucnv_bld.c and ucnv_reset()
     */

    /* toUnicode */
    cnv->toUnicodeStatus=0;     /* offset */
    cnv->mode=0;                /* state */
    cnv->toULength=0;           /* byteIndex */

    /* fromUnicode */
    cnv->fromUChar32=0;
    cnv->fromUnicodeStatus=1;   /* prevLength */
#endif
}